

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int subjournalPage(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPager;
  sqlite3_file *psVar2;
  void *pvVar3;
  int iVar4;
  undefined8 in_RAX;
  MemJournal *p;
  long lVar5;
  undefined8 uStack_28;
  
  pPager = pPg->pPager;
  iVar4 = 0;
  uStack_28 = in_RAX;
  if (pPager->journalMode != '\x02') {
    psVar2 = pPager->sjfd;
    iVar4 = 0;
    if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
      if ((pPager->journalMode == '\x04') || (pPager->subjInMemory != '\0')) {
        psVar2->pMethods = (sqlite3_io_methods *)0x0;
        psVar2[1].pMethods = (sqlite3_io_methods *)0x0;
        psVar2[4].pMethods = (sqlite3_io_methods *)0x0;
        psVar2[5].pMethods = (sqlite3_io_methods *)0x0;
        psVar2[2].pMethods = (sqlite3_io_methods *)0x0;
        psVar2[3].pMethods = (sqlite3_io_methods *)0x0;
        psVar2->pMethods = &MemJournalMethods;
      }
      else {
        iVar4 = (*pPager->pVfs->xOpen)(pPager->pVfs,(char *)0x0,psVar2,0x201e,(int *)0x0);
      }
    }
    if (iVar4 == 0) {
      pvVar3 = pPg->pData;
      lVar5 = ((long)pPager->pageSize + 4) * (ulong)pPager->nSubRec;
      uVar1 = pPg->pgno;
      uStack_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18,(undefined4)uStack_28);
      iVar4 = (*pPager->sjfd->pMethods->xWrite)(pPager->sjfd,(void *)((long)&uStack_28 + 4),4,lVar5)
      ;
      if (iVar4 == 0) {
        iVar4 = (*pPager->sjfd->pMethods->xWrite)(pPager->sjfd,pvVar3,pPager->pageSize,lVar5 + 4);
      }
    }
  }
  if (iVar4 == 0) {
    pPager->nSubRec = pPager->nSubRec + 1;
    iVar4 = addToSavepointBitvecs(pPager,pPg->pgno);
  }
  return iVar4;
}

Assistant:

static int subjournalPage(PgHdr *pPg){
  int rc = SQLITE_OK;
  Pager *pPager = pPg->pPager;
  if( pPager->journalMode!=PAGER_JOURNALMODE_OFF ){

    /* Open the sub-journal, if it has not already been opened */
    assert( pPager->useJournal );
    assert( isOpen(pPager->jfd) || pagerUseWal(pPager) );
    assert( isOpen(pPager->sjfd) || pPager->nSubRec==0 );
    assert( pagerUseWal(pPager) 
         || pageInJournal(pPg) 
         || pPg->pgno>pPager->dbOrigSize 
    );
    rc = openSubJournal(pPager);

    /* If the sub-journal was opened successfully (or was already open),
    ** write the journal record into the file.  */
    if( rc==SQLITE_OK ){
      void *pData = pPg->pData;
      i64 offset = (i64)pPager->nSubRec*(4+pPager->pageSize);
      char *pData2;
  
      CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
      PAGERTRACE(("STMT-JOURNAL %d page %d\n", PAGERID(pPager), pPg->pgno));
      rc = write32bits(pPager->sjfd, offset, pPg->pgno);
      if( rc==SQLITE_OK ){
        rc = sqlite3OsWrite(pPager->sjfd, pData2, pPager->pageSize, offset+4);
      }
    }
  }
  if( rc==SQLITE_OK ){
    pPager->nSubRec++;
    assert( pPager->nSavepoint>0 );
    rc = addToSavepointBitvecs(pPager, pPg->pgno);
  }
  return rc;
}